

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::CaseGenerateSyntax::CaseGenerateSyntax
          (CaseGenerateSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,Token openParen,ExpressionSyntax *condition,Token closeParen,
          SyntaxList<slang::syntax::CaseItemSyntax> *items,Token endCase)

{
  size_t sVar1;
  pointer ppAVar2;
  pointer ppCVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  
  uVar6 = keyword._0_8_;
  uVar7 = openParen._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = CaseGenerate;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00698df0;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00698d40;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar8 = 0;
    do {
      *(CaseGenerateSyntax **)(*(long *)((long)ppAVar2 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->openParen).kind = (short)uVar7;
  (this->openParen).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->openParen).info = openParen.info;
  (this->condition).ptr = condition;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  uVar5 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00698df0;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  sVar1 = (items->super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (items->super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006991d8;
  (this->endCase).kind = endCase.kind;
  (this->endCase).field_0x2 = endCase._2_1_;
  (this->endCase).numFlags = (NumericTokenFlags)endCase.numFlags.raw;
  (this->endCase).rawLen = endCase.rawLen;
  (this->endCase).info = endCase.info;
  (condition->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppCVar3 = (this->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar8 = 0;
    do {
      *(CaseGenerateSyntax **)(*(long *)((long)ppCVar3 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  return;
}

Assistant:

CaseGenerateSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token openParen, ExpressionSyntax& condition, Token closeParen, const SyntaxList<CaseItemSyntax>& items, Token endCase) :
        MemberSyntax(SyntaxKind::CaseGenerate, attributes), keyword(keyword), openParen(openParen), condition(&condition), closeParen(closeParen), items(items), endCase(endCase) {
        this->condition->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }